

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O3

int __thiscall Fl_Check_Browser::lineno(Fl_Check_Browser *this,cb_item *p0)

{
  cb_item *pcVar1;
  int iVar2;
  
  pcVar1 = this->first;
  if (pcVar1 != (cb_item *)0x0) {
    iVar2 = 1;
    do {
      if (pcVar1 == p0) {
        return iVar2;
      }
      iVar2 = iVar2 + 1;
      pcVar1 = pcVar1->next;
    } while (pcVar1 != (cb_item *)0x0);
  }
  return 0;
}

Assistant:

int Fl_Check_Browser::lineno(cb_item *p0) const {
	cb_item *p = first;

	if (p == 0) {
		return 0;
	}

	int i = 1;
	while (p) {
		if (p == p0) {
			return i;
		}
		i++;
		p = p->next;
	}

	return 0;
}